

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# executor.hpp
# Opt level: O2

void __thiscall tf::Executor::_decrement_topology(Executor *this)

{
  size_t *psVar1;
  
  std::mutex::lock(&this->_topology_mutex);
  psVar1 = &this->_num_topologies;
  *psVar1 = *psVar1 - 1;
  if (*psVar1 == 0) {
    std::condition_variable::notify_all();
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->_topology_mutex);
  return;
}

Assistant:

inline void Executor::_decrement_topology() {
#if __cplusplus >= TF_CPP20
  if(_num_topologies.fetch_sub(1, std::memory_order_acq_rel) == 1) {
    _num_topologies.notify_all();
  }
#else
  std::lock_guard<std::mutex> lock(_topology_mutex);
  if(--_num_topologies == 0) {
    _topology_cv.notify_all();
  }
#endif
}